

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

MainFunc __thiscall capnp::compiler::CompilerMain::getEncodeMain(CompilerMain *this)

{
  StringPtr extendedDescription;
  StringPtr helpText;
  Iface *pIVar1;
  Iface *pIVar2;
  MainBuilder *pMVar3;
  Iface *extraout_RDX;
  CompilerMain *in_RSI;
  initializer_list<kj::MainBuilder::OptionName> names;
  initializer_list<kj::MainBuilder::OptionName> names_00;
  initializer_list<kj::MainBuilder::OptionName> names_01;
  StringPtr title;
  StringPtr title_00;
  MainFunc MVar4;
  StringPtr version;
  StringPtr briefDescription;
  StringPtr helpText_00;
  StringPtr helpText_01;
  StringPtr argumentTitle;
  MainBuilder builder;
  Function<kj::MainBuilder::Validity_()> local_e8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_d8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_c8;
  Function<kj::MainBuilder::Validity_(kj::StringPtr)> local_b8;
  Function<kj::MainBuilder::Validity_()> local_a8;
  Function<kj::MainBuilder::Validity_()> local_98;
  MainBuilder local_88;
  char *local_78;
  undefined8 uStack_70;
  OptionName local_68;
  OptionName local_58;
  char *local_48;
  undefined8 uStack_40;
  OptionName local_38;
  undefined1 local_28;
  char *local_20;
  
  in_RSI->annotationFlag = DROP_ANNOTATIONS;
  in_RSI->compileEagerness = 1;
  local_48 = 
  "Note that the current implementation reads the entire input into memory before beginning to encode.  A better implementation would read and encode one message at a time."
  ;
  uStack_40 = 0xaa;
  extendedDescription.content.size_ = 0xaa;
  extendedDescription.content.ptr =
       "Note that the current implementation reads the entire input into memory before beginning to encode.  A better implementation would read and encode one message at a time."
  ;
  version.content.size_ = 0x1e;
  version.content.ptr = "Cap\'n Proto version (unknown)";
  briefDescription.content.size_ = 0x1dc;
  briefDescription.content.ptr =
       "Encodes one or more textual Cap\'n Proto messages to binary.  The messages have root type <type> defined in <schema-file>.  Messages are read from standard input.  Each message is a parenthesized struct literal, like the format used to specify constants and default values of struct type in the schema language.  For example:\n    (foo = 123, bar = \"hello\", baz = [true, false, true])\nThe input may contain any number of such values; each will be encoded as a separate message."
  ;
  kj::MainBuilder::MainBuilder
            (&local_88,in_RSI->context,version,briefDescription,extendedDescription);
  addGlobalOptions(in_RSI,&local_88);
  local_58.isLong = true;
  local_58.field_1.longName = "flat";
  local_98.impl.ptr = (Iface *)operator_new(0x18);
  (local_98.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002caf88;
  local_98.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_98.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::{lambda(auto:1&,(auto:2&&)...)#1},capnp::compiler::CompilerMain::getEncodeMain()::{lambda(auto:1&,(auto:2&&)...)#2}>>>
        ::instance;
  names._M_len = 1;
  names._M_array = &local_58;
  helpText_00.content.size_ = 0x59;
  helpText_00.content.ptr =
       "Expect only one input value, serializing it as a single-segment message with no framing.";
  pMVar3 = kj::MainBuilder::addOption(&local_88,names,&local_98,helpText_00);
  local_38.isLong = false;
  local_38.field_1.shortName = 'p';
  local_28 = 1;
  local_20 = "packed";
  local_a8.impl.ptr = (Iface *)operator_new(0x18);
  (local_a8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002caff0;
  local_a8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_a8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::{lambda(auto:1&,(auto:2&&)...)#3},capnp::compiler::CompilerMain::getEncodeMain()::{lambda(auto:1&,(auto:2&&)...)#4}>>>
        ::instance;
  names_00._M_len = 2;
  names_00._M_array = &local_38;
  helpText_01.content.size_ = 0xff;
  helpText_01.content.ptr =
       "Pack the output message with standard Cap\'n Proto packing, which deflates zero-valued bytes.  (This writes messages using capnp::writePackedMessage() from <capnp/serialize-packed.h>.  Without this, capnp::writeMessage() from <capnp/serialize.h> is used.)"
  ;
  pMVar3 = kj::MainBuilder::addOption(pMVar3,names_00,&local_a8,helpText_01);
  local_68.isLong = true;
  local_68.field_1.longName = "segment-size";
  local_b8.impl.ptr = (Iface *)operator_new(0x18);
  (local_b8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002cb058;
  local_b8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_b8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::{lambda(auto:1&,(auto:2&&)...)#5},capnp::compiler::CompilerMain::getEncodeMain()::{lambda(auto:1&,(auto:2&&)...)#6}>>>
        ::instance;
  local_78 = 
  "Sets the preferred segment size on the MallocMessageBuilder to <n> words and turns off heuristic growth.  This flag is mainly useful for testing.  Without it, each message will be written as a single segment."
  ;
  uStack_70 = 0xd1;
  helpText.content.size_ = 0xd1;
  helpText.content.ptr =
       "Sets the preferred segment size on the MallocMessageBuilder to <n> words and turns off heuristic growth.  This flag is mainly useful for testing.  Without it, each message will be written as a single segment."
  ;
  names_01._M_len = 1;
  names_01._M_array = &local_68;
  argumentTitle.content.size_ = 4;
  argumentTitle.content.ptr = "<n>";
  pMVar3 = kj::MainBuilder::addOptionWithArg(pMVar3,names_01,&local_b8,argumentTitle,helpText);
  local_c8.impl.ptr = (Iface *)operator_new(0x18);
  (local_c8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002cb0c0;
  local_c8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_c8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::{lambda(auto:1&,(auto:2&&)...)#7},capnp::compiler::CompilerMain::getEncodeMain()::{lambda(auto:1&,(auto:2&&)...)#8}>>>
        ::instance;
  title.content.size_ = 0xe;
  title.content.ptr = "<schema-file>";
  pMVar3 = kj::MainBuilder::expectArg(pMVar3,title,&local_c8);
  local_d8.impl.ptr = (Iface *)operator_new(0x18);
  (local_d8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002cb128;
  local_d8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_d8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity(kj::StringPtr)>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::{lambda(auto:1&,(auto:2&&)...)#9},capnp::compiler::CompilerMain::getEncodeMain()::{lambda(auto:1&,(auto:2&&)...)#10}>>>
        ::instance;
  title_00.content.size_ = 7;
  title_00.content.ptr = "<type>";
  pMVar3 = kj::MainBuilder::expectArg(pMVar3,title_00,&local_d8);
  local_e8.impl.ptr = (Iface *)operator_new(0x18);
  (local_e8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002cb190;
  local_e8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_e8.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getEncodeMain()::{lambda(auto:1&,(auto:2&&)...)#11},capnp::compiler::CompilerMain::getEncodeMain()::{lambda(auto:1&,(auto:2&&)...)#12}>>>
        ::instance;
  kj::MainBuilder::callAfterParsing(pMVar3,&local_e8);
  pIVar1 = local_e8.impl.ptr;
  if (local_e8.impl.ptr != (Iface *)0x0) {
    local_e8.impl.ptr = (Iface *)0x0;
    (**(local_e8.impl.disposer)->_vptr_Disposer)
              (local_e8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pIVar2 = local_d8.impl.ptr;
  if (local_d8.impl.ptr != (Iface *)0x0) {
    local_d8.impl.ptr = (Iface *)0x0;
    (**(local_d8.impl.disposer)->_vptr_Disposer)
              (local_d8.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar2 = local_c8.impl.ptr;
  if (local_c8.impl.ptr != (Iface *)0x0) {
    local_c8.impl.ptr = (Iface *)0x0;
    (**(local_c8.impl.disposer)->_vptr_Disposer)
              (local_c8.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar2 = local_b8.impl.ptr;
  if (local_b8.impl.ptr != (Iface *)0x0) {
    local_b8.impl.ptr = (Iface *)0x0;
    (**(local_b8.impl.disposer)->_vptr_Disposer)
              (local_b8.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  pIVar1 = local_a8.impl.ptr;
  if (local_a8.impl.ptr != (Iface *)0x0) {
    local_a8.impl.ptr = (Iface *)0x0;
    (**(local_a8.impl.disposer)->_vptr_Disposer)
              (local_a8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  pIVar1 = local_98.impl.ptr;
  if (local_98.impl.ptr != (Iface *)0x0) {
    local_98.impl.ptr = (Iface *)0x0;
    (**(local_98.impl.disposer)->_vptr_Disposer)
              (local_98.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
  }
  kj::MainBuilder::build((MainBuilder *)this);
  kj::MainBuilder::~MainBuilder(&local_88);
  MVar4.impl.ptr = extraout_RDX;
  MVar4.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar4.impl;
}

Assistant:

kj::MainFunc getEncodeMain() {
    // Only parse the schemas we actually need for decoding.
    compileEagerness = Compiler::NODE;

    // Drop annotations since we don't need them.  This avoids importing files like c++.capnp.
    annotationFlag = Compiler::DROP_ANNOTATIONS;

    kj::MainBuilder builder(context, VERSION_STRING,
          "Encodes one or more textual Cap'n Proto messages to binary.  The messages have root "
          "type <type> defined in <schema-file>.  Messages are read from standard input.  Each "
          "message is a parenthesized struct literal, like the format used to specify constants "
          "and default values of struct type in the schema language.  For example:\n"
          "    (foo = 123, bar = \"hello\", baz = [true, false, true])\n"
          "The input may contain any number of such values; each will be encoded as a separate "
          "message.",

          "Note that the current implementation reads the entire input into memory before "
          "beginning to encode.  A better implementation would read and encode one message at "
          "a time.");
    addGlobalOptions(builder);
    builder.addOption({"flat"}, KJ_BIND_METHOD(*this, codeFlat),
                      "Expect only one input value, serializing it as a single-segment message "
                      "with no framing.")
           .addOption({'p', "packed"}, KJ_BIND_METHOD(*this, codePacked),
                      "Pack the output message with standard Cap'n Proto packing, which "
                      "deflates zero-valued bytes.  (This writes messages using "
                      "capnp::writePackedMessage() from <capnp/serialize-packed.h>.  Without "
                      "this, capnp::writeMessage() from <capnp/serialize.h> is used.)")
           .addOptionWithArg({"segment-size"}, KJ_BIND_METHOD(*this, setSegmentSize), "<n>",
                             "Sets the preferred segment size on the MallocMessageBuilder to <n> "
                             "words and turns off heuristic growth.  This flag is mainly useful "
                             "for testing.  Without it, each message will be written as a single "
                             "segment.")
           .expectArg("<schema-file>", KJ_BIND_METHOD(*this, addSource))
           .expectArg("<type>", KJ_BIND_METHOD(*this, setRootType))
           .callAfterParsing(KJ_BIND_METHOD(*this, encode));
    return builder.build();
  }